

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::GPUShaderFP64Test5::iterate(GPUShaderFP64Test5 *this)

{
  bool bVar1;
  NotSupportedError *pNVar2;
  char *description;
  long lVar3;
  long *plVar4;
  _test_case test_cases [29];
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  undefined1 local_578 [16];
  undefined8 local_568;
  undefined4 local_560;
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  undefined8 local_538;
  undefined4 local_530;
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined8 local_508;
  undefined4 local_500;
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  undefined4 local_4a0;
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  undefined8 local_478;
  undefined4 local_470;
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined4 local_440;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined8 local_418;
  undefined4 local_410;
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined4 local_3e0;
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined4 local_380;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined4 local_350;
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined4 local_320;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined4 local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined4 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined4 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined4 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined4 local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined4 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_598._0_8_ = local_598 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_598,"GL_ARB_gpu_shader_fp64 is not supported.","");
    tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)local_598);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_vertex_attrib_64bit")
  ;
  if (bVar1) {
    initTest(this);
    local_598._0_8_ = (pointer)0x1200000001;
    local_598._8_4_ = 4;
    local_588._M_allocated_capacity = (size_type)local_578;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_598 + 0x10),0x1aee929);
    local_568 = 0x1300000001;
    local_560 = 0xe;
    local_558[0] = local_548;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_558,0x1aee929);
    local_538 = 0x1400000001;
    local_530 = 0xf;
    local_528[0] = local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,0x1aee929);
    local_508 = 0x1500000001;
    local_500 = 0x10;
    local_4f8[0] = local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,0x1aee929);
    local_4d8 = 0x1f00000001;
    local_4d0 = 4;
    local_4c8[0] = local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,0x1aee929);
    local_4a8 = 0x2000000001;
    local_4a0 = 0xe;
    local_498[0] = local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,0x1aee929);
    local_478 = 0x2100000001;
    local_470 = 0xf;
    local_468[0] = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,0x1aee929);
    local_448 = 0x2200000001;
    local_440 = 0x10;
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,0x1aee929);
    local_418 = 0x1100000001;
    local_410 = 4;
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,0x1aee929);
    local_3e8 = 0x2300000001;
    local_3e0 = 0xe;
    local_3d8[0] = local_3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,0x1aee929);
    local_3b8 = 0x2400000001;
    local_3b0 = 0xf;
    local_3a8[0] = local_398;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,0x1aee929);
    local_388 = 0x2500000001;
    local_380 = 0x10;
    local_378[0] = local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,0x1aee929);
    local_358 = 0x1600000001;
    local_350 = 5;
    local_348[0] = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,0x1aee929);
    local_328 = 0x1900000001;
    local_320 = 8;
    local_318[0] = local_308;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_318,0x1aee929);
    local_2f8 = 0x1c00000001;
    local_2f0 = 0xb;
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,0x1aee929);
    local_2c8 = 0x1700000001;
    local_2c0 = 6;
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,0x1aee929);
    local_298 = 0x1800000001;
    local_290 = 7;
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,0x1aee929);
    local_268 = 0x1a00000001;
    local_260 = 9;
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,0x1aee929);
    local_238 = 0x1b00000001;
    local_230 = 10;
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,0x1aee929);
    local_208 = 0x1d00000001;
    local_200 = 0xc;
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,0x1aee929);
    local_1d8 = 0x1e00000001;
    local_1d0 = 0xd;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1aee929);
    local_1a8 = 0x1200000000;
    local_1a0 = 4;
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,0x1aee929);
    local_178 = 0x1f00000000;
    local_170 = 4;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,0x1aee929);
    local_148 = 0x1100000000;
    local_140 = 4;
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,0x1aee929);
    local_118 = 0x400000000;
    local_110 = 0x12;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,0x1aee929);
    local_e8 = 0x400000000;
    local_e0 = 0x1f;
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,0x1aee929);
    local_b8 = 0x400000000;
    local_b0 = 0x11;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,0x1aee929);
    local_88 = 0x400000000;
    local_80 = 0;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1aee929);
    local_58 = 0;
    local_50 = 4;
    plVar4 = local_38;
    local_48[0] = plVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,0x1aee929);
    lVar3 = 0;
    do {
      initIteration(this,(_test_case *)(local_598 + lVar3));
      bVar1 = executeIteration(this,(_test_case *)(local_598 + lVar3));
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
      deinitInteration(this);
      lVar3 = lVar3 + 0x30;
    } while (lVar3 != 0x570);
    description = "Fail";
    if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,description);
    lVar3 = -0x570;
    do {
      if (plVar4 != (long *)plVar4[-2]) {
        operator_delete((long *)plVar4[-2],*plVar4 + 1);
      }
      plVar4 = plVar4 + -6;
      lVar3 = lVar3 + 0x30;
    } while (lVar3 != 0);
    return STOP;
  }
  pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_598._0_8_ = local_598 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_598,"GL_ARB_vertex_attrib_64bit is not supported.","");
  tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)local_598);
  __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test5::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* test case type */ /* source type */ /* destination type */
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, "" },

		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_INT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_UINT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_FLOAT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_BOOL, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_BOOL, Utils::VARIABLE_TYPE_DOUBLE, "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

		/* Release the GL Resource for this sub test */
		deinitInteration();

	} /* for (all test cases) */
	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}